

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O0

String * asl::Directory::createTemp(void)

{
  bool bVar1;
  char *pcVar2;
  String *in_RDI;
  double dVar3;
  File local_a8;
  String local_60;
  uint local_44;
  undefined1 local_40 [4];
  uint pid;
  String tmpDir;
  uint p;
  uint num;
  String *dir;
  
  asl::String::String(in_RDI);
  dVar3 = now();
  fract<double>(dVar3 * 0.01);
  tmpDir.field_2._8_4_ = SUB84(in_RDI,0);
  asl::String::String((String *)local_40,"/tmp");
  local_44 = getpid();
  do {
    pcVar2 = asl::String::operator*((String *)local_40);
    asl::String::f(&local_60,"%s/%04x%08x%08x",pcVar2,(ulong)local_44,
                   (ulong)(uint)tmpDir.field_2._8_4_);
    asl::String::operator=(in_RDI,&local_60);
    asl::String::~String(&local_60);
    File::File(&local_a8,in_RDI);
    bVar1 = File::exists(&local_a8);
    File::~File(&local_a8);
  } while (bVar1);
  create(in_RDI);
  asl::String::~String((String *)local_40);
  return in_RDI;
}

Assistant:

String Directory::createTemp()
{
	String dir;
	unsigned num = (unsigned)(2e9 * fract(0.01 * now()));
	unsigned p = (unsigned int)(size_t)&dir;
#ifdef _WIN32
	TCHAR tmpdir[MAX_PATH];
	DWORD ret = GetTempPath(MAX_PATH, tmpdir);
	String tmpDir = tmpdir;
	if (ret > MAX_PATH || ret == 0)
		return dir;
	unsigned pid = (unsigned int)GetCurrentProcessId();
#else
	String tmpDir = "/tmp";
	unsigned pid = (unsigned)getpid();
#endif
	do {
		dir = String::f("%s/%04x%08x%08x", *tmpDir, pid, p, num++);
	} while (File(dir).exists());
	create(dir);
	return dir;
}